

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O0

void Lpk_ManStop(Lpk_Man_t *p)

{
  If_Par_t *__ptr;
  void *pPars;
  int i;
  Lpk_Man_t *p_local;
  
  if (p->ppTruths[0][0] != (uint *)0x0) {
    free(p->ppTruths[0][0]);
    p->ppTruths[0][0] = (uint *)0x0;
  }
  Vec_IntFree(p->vBddDir);
  Vec_IntFree(p->vBddInv);
  Vec_IntFree(p->vMemory);
  Kit_DsdManFree(p->pDsdMan);
  for (pPars._4_4_ = 0; pPars._4_4_ < 8; pPars._4_4_ = pPars._4_4_ + 1) {
    Vec_IntFree(p->vSets[pPars._4_4_]);
  }
  if (p->pIfMan != (If_Man_t *)0x0) {
    __ptr = p->pIfMan->pPars;
    If_ManStop(p->pIfMan);
    if (__ptr != (If_Par_t *)0x0) {
      free(__ptr);
    }
  }
  if (p->vLevels != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vLevels);
  }
  if (p->vVisited != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vVisited);
  }
  Vec_PtrFree(p->vLeaves);
  Vec_IntFree(p->vCover);
  Vec_PtrFree(p->vTtElems);
  Vec_PtrFree(p->vTtNodes);
  if (p != (Lpk_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Lpk_ManStop( Lpk_Man_t * p )
{
    int i;
    ABC_FREE( p->ppTruths[0][0] );
    Vec_IntFree( p->vBddDir );
    Vec_IntFree( p->vBddInv );
    Vec_IntFree( p->vMemory );
    Kit_DsdManFree( p->pDsdMan );
    for ( i = 0; i < 8; i++ )
        Vec_IntFree(p->vSets[i]);
    if ( p->pIfMan )
    {
        void * pPars = p->pIfMan->pPars;
        If_ManStop( p->pIfMan );
        ABC_FREE( pPars );
    }
    if ( p->vLevels )
        Vec_VecFree( p->vLevels );
    if ( p->vVisited )
        Vec_VecFree( p->vVisited );
    Vec_PtrFree( p->vLeaves );
    Vec_IntFree( p->vCover );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}